

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printc.cc
# Opt level: O2

void __thiscall PrintC::emitBlockInfLoop(PrintC *this,BlockInfLoop *bl)

{
  uint4 *puVar1;
  EmitXml *pEVar2;
  FlowBlock *pFVar3;
  pointer puVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  undefined4 extraout_var;
  
  PrintLanguage::pushMod(&this->super_PrintLanguage);
  puVar1 = &(this->super_PrintLanguage).mods;
  *puVar1 = *puVar1 & 0xfffffe7f;
  emitAnyLabelStatement(this,(FlowBlock *)bl);
  (*((this->super_PrintLanguage).emit)->_vptr_EmitXml[8])();
  pEVar2 = (this->super_PrintLanguage).emit;
  (*pEVar2->_vptr_EmitXml[0x19])(pEVar2,"do",0);
  pEVar2 = (this->super_PrintLanguage).emit;
  (*pEVar2->_vptr_EmitXml[0x21])(pEVar2,1,0);
  uVar5 = (*((this->super_PrintLanguage).emit)->_vptr_EmitXml[0x22])();
  pEVar2 = (this->super_PrintLanguage).emit;
  (*pEVar2->_vptr_EmitXml[0x19])(pEVar2,"{",8);
  pEVar2 = (this->super_PrintLanguage).emit;
  uVar6 = (*pEVar2->_vptr_EmitXml[6])
                    (pEVar2,*(bl->super_BlockGraph).list.
                             super__Vector_base<FlowBlock_*,_std::allocator<FlowBlock_*>_>._M_impl.
                             super__Vector_impl_data._M_start);
  pFVar3 = *(bl->super_BlockGraph).list.
            super__Vector_base<FlowBlock_*,_std::allocator<FlowBlock_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  (*pFVar3->_vptr_FlowBlock[0xc])(pFVar3,this);
  pEVar2 = (this->super_PrintLanguage).emit;
  (*pEVar2->_vptr_EmitXml[7])(pEVar2,(ulong)uVar6);
  pEVar2 = (this->super_PrintLanguage).emit;
  (*pEVar2->_vptr_EmitXml[0x23])(pEVar2,(ulong)uVar5);
  (*((this->super_PrintLanguage).emit)->_vptr_EmitXml[8])();
  pEVar2 = (this->super_PrintLanguage).emit;
  (*pEVar2->_vptr_EmitXml[0x19])(pEVar2,"}",8);
  pEVar2 = (this->super_PrintLanguage).emit;
  (*pEVar2->_vptr_EmitXml[0x21])(pEVar2,1,0);
  iVar7 = (*(*(bl->super_BlockGraph).list.
              super__Vector_base<FlowBlock_*,_std::allocator<FlowBlock_*>_>._M_impl.
              super__Vector_impl_data._M_start)->_vptr_FlowBlock[0xe])();
  pEVar2 = (this->super_PrintLanguage).emit;
  (*pEVar2->_vptr_EmitXml[0x13])(pEVar2,"while",0,CONCAT44(extraout_var,iVar7));
  pEVar2 = (this->super_PrintLanguage).emit;
  uVar5 = (*pEVar2->_vptr_EmitXml[0x1a])(pEVar2,0x28,0);
  pEVar2 = (this->super_PrintLanguage).emit;
  (*pEVar2->_vptr_EmitXml[0x21])(pEVar2,1,0);
  pEVar2 = (this->super_PrintLanguage).emit;
  (*pEVar2->_vptr_EmitXml[0x19])(pEVar2,"true",5);
  pEVar2 = (this->super_PrintLanguage).emit;
  (*pEVar2->_vptr_EmitXml[0x21])(pEVar2,1,0);
  pEVar2 = (this->super_PrintLanguage).emit;
  (*pEVar2->_vptr_EmitXml[0x1b])(pEVar2,0x29,(ulong)uVar5);
  pEVar2 = (this->super_PrintLanguage).emit;
  (*pEVar2->_vptr_EmitXml[0x19])(pEVar2,";",8);
  puVar4 = (this->super_PrintLanguage).modstack.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (this->super_PrintLanguage).mods = puVar4[-1];
  (this->super_PrintLanguage).modstack.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = puVar4 + -1;
  return;
}

Assistant:

void PrintC::emitBlockInfLoop(const BlockInfLoop *bl)

{
  const PcodeOp *op;

  pushMod();
  unsetMod(no_branch|only_branch);
  emitAnyLabelStatement(bl);
  emit->tagLine();
  emit->print("do",EmitXml::keyword_color);
  emit->spaces(1);
  int4 id = emit->startIndent();
  emit->print("{");
  int4 id1 = emit->beginBlock(bl->getBlock(0));
  bl->getBlock(0)->emit(this);
  emit->endBlock(id1);
  emit->stopIndent(id);
  emit->tagLine();
  emit->print("}");
  emit->spaces(1);
  op = bl->getBlock(0)->lastOp();
  emit->tagOp("while",EmitXml::keyword_color,op);
  int4 id2 = emit->openParen('(');
  emit->spaces(1);
  emit->print("true",EmitXml::const_color);
  emit->spaces(1);
  emit->closeParen(')',id2);
  emit->print(";");
  popMod();
}